

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall re2::BitState::ShouldVisit(BitState *this,int id,char *p)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint16_t *puVar5;
  size_type sVar6;
  const_pointer pcVar7;
  uint *puVar8;
  char in_DL;
  int in_ESI;
  long in_RDI;
  bool bVar9;
  int n;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  
  puVar5 = Prog::list_heads((Prog *)0x23c144);
  uVar3 = (uint)puVar5[in_ESI];
  sVar6 = StringPiece::size((StringPiece *)(in_RDI + 8));
  cVar2 = (char)uVar3;
  pcVar7 = StringPiece::data((StringPiece *)(in_RDI + 8));
  bVar1 = cVar2 * ((char)sVar6 + '\x01') + (in_DL - (char)pcVar7);
  puVar8 = PODArray<unsigned_int>::operator[]
                     ((PODArray<unsigned_int> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
  bVar9 = (*puVar8 & 1 << (bVar1 & 0x1f)) == 0;
  if (bVar9) {
    uVar4 = 1 << (bVar1 & 0x1f);
    puVar8 = PODArray<unsigned_int>::operator[]
                       ((PODArray<unsigned_int> *)CONCAT44(uVar3,uVar4),in_stack_ffffffffffffffbc);
    *puVar8 = uVar4 | *puVar8;
  }
  return bVar9;
}

Assistant:

bool BitState::ShouldVisit(int id, const char* p) {
  int n = prog_->list_heads()[id] * static_cast<int>(text_.size()+1) +
          static_cast<int>(p-text_.data());
  if (visited_[n/VisitedBits] & (1 << (n & (VisitedBits-1))))
    return false;
  visited_[n/VisitedBits] |= 1 << (n & (VisitedBits-1));
  return true;
}